

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringClass.cpp
# Opt level: O0

int __thiscall String::sprintf(String *this,char *__s,char *__format,...)

{
  char in_AL;
  int iVar1;
  char *__s_00;
  char *extraout_RAX;
  undefined8 in_RCX;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  undefined1 local_f8 [16];
  char *local_e8;
  undefined8 local_e0;
  undefined8 local_d8;
  undefined8 local_d0;
  undefined8 local_c8;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined4 local_48;
  undefined4 local_44;
  va_list va;
  int bufsize;
  char *buf;
  char *fmtstr_local;
  String *this_local;
  
  if (in_AL != '\0') {
    local_c8 = in_XMM0_Qa;
    local_b8 = in_XMM1_Qa;
    local_a8 = in_XMM2_Qa;
    local_98 = in_XMM3_Qa;
    local_88 = in_XMM4_Qa;
    local_78 = in_XMM5_Qa;
    local_68 = in_XMM6_Qa;
    local_58 = in_XMM7_Qa;
  }
  va[0].overflow_arg_area = local_f8;
  va[0]._0_8_ = &stack0x00000008;
  local_44 = 0x30;
  local_48 = 0x10;
  local_e8 = __format;
  local_e0 = in_RCX;
  local_d8 = in_R8;
  local_d0 = in_R9;
  do {
    __s_00 = (char *)operator_new__(0x100);
    iVar1 = vsnprintf(__s_00,0x100,__s,&local_48);
  } while (0xff < iVar1);
  std::__cxx11::string::operator=((string *)this,__s_00);
  if (__s_00 != (char *)0x0) {
    operator_delete__(__s_00);
    __s_00 = extraout_RAX;
  }
  return (int)__s_00;
}

Assistant:

void String::sprintf (const char* fmtstr, ...)
{
	char* buf;
	int bufsize = 256;
	va_list va;
	va_start (va, fmtstr);

	do
		buf = new char[bufsize];
	while (vsnprintf (buf, bufsize, fmtstr, va) >= bufsize);

	va_end (va);
	_string = buf;
	delete[] buf;
}